

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_string.cc
# Opt level: O1

void SplitStringToSetUsing
               (string *full,char *delim,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  Logger local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (delim == (char *)0x0) {
    local_74.severity_ = ERR;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SplitStringToSetUsing","");
    poVar4 = Logger::Start(ERR,&local_70,0x3e,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"delim != NULL",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::operator<<(poVar4,"\n");
  }
  else {
    if (result != (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
      cVar1 = *delim;
      if ((cVar1 == '\0') || (delim[1] != '\0')) {
        strlen(delim);
        uVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim,0);
        if (uVar2 != 0xffffffffffffffff) {
          do {
            strlen(delim);
            uVar2 = std::__cxx11::string::find_first_of((char *)full,(ulong)delim,uVar2);
            if (uVar2 == 0xffffffffffffffff) {
              std::__cxx11::string::substr((ulong)&local_70,(ulong)full);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)result,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p == &local_70.field_2) {
                return;
              }
              operator_delete(local_70._M_dataplus._M_p);
              return;
            }
            std::__cxx11::string::substr((ulong)&local_70,(ulong)full);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)result,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            strlen(delim);
            uVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim,uVar2);
          } while (uVar2 != 0xffffffffffffffff);
        }
      }
      else if (full->_M_string_length != 0) {
        pcVar5 = (full->_M_dataplus)._M_p;
        pcVar6 = pcVar5 + full->_M_string_length;
        do {
          pcVar3 = pcVar5;
          if (*pcVar5 == cVar1) {
            pcVar5 = pcVar5 + 1;
          }
          else {
            do {
              pcVar3 = pcVar3 + 1;
              pcVar7 = pcVar6;
              if (pcVar3 == pcVar6) break;
              pcVar7 = pcVar3;
            } while (*pcVar3 != cVar1);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar5,pcVar7);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)result,&local_70);
            pcVar5 = pcVar7;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
        } while (pcVar5 != pcVar6);
      }
      return;
    }
    local_74.severity_ = ERR;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SplitStringToSetUsing","");
    poVar4 = Logger::Start(ERR,&local_70,0x3f,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"result != NULL",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_74);
  abort();
}

Assistant:

void SplitStringToSetUsing(const std::string& full,
                           const char* delim,
                           std::set<std::string>* result) {
  CHECK(delim != NULL);
  CHECK(result != NULL);
  simple_insert_iterator<std::set<std::string> > it(result);
  SplitStringToIteratorUsing(full, delim, it);
}